

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rldata.hpp
# Opt level: O1

bool __thiscall relive::Stream::needsUpdate(Stream *this,Stream *ns)

{
  size_t sVar1;
  bool bVar2;
  int iVar3;
  
  if (((this->_reliveId == ns->_reliveId) && (this->_stationId == ns->_stationId)) &&
     (sVar1 = (this->_name)._M_string_length, sVar1 == (ns->_name)._M_string_length)) {
    if ((sVar1 != 0) &&
       (iVar3 = bcmp((this->_name)._M_dataplus._M_p,(ns->_name)._M_dataplus._M_p,sVar1), iVar3 != 0)
       ) {
      return true;
    }
    sVar1 = (this->_host)._M_string_length;
    if (sVar1 == (ns->_host)._M_string_length) {
      if ((sVar1 != 0) &&
         (iVar3 = bcmp((this->_host)._M_dataplus._M_p,(ns->_host)._M_dataplus._M_p,sVar1),
         iVar3 != 0)) {
        return true;
      }
      sVar1 = (this->_description)._M_string_length;
      if (sVar1 == (ns->_description)._M_string_length) {
        if ((sVar1 != 0) &&
           (iVar3 = bcmp((this->_description)._M_dataplus._M_p,(ns->_description)._M_dataplus._M_p,
                         sVar1), iVar3 != 0)) {
          return true;
        }
        if ((((((this->_timestamp == ns->_timestamp) && (this->_duration == ns->_duration)) &&
              (this->_size == ns->_size)) &&
             ((bVar2 = std::operator!=(&this->_format,&ns->_format), !bVar2 &&
              (this->_mediaOffset == ns->_mediaOffset)))) &&
            ((this->_streamInfoChecksum == ns->_streamInfoChecksum &&
             ((this->_chatChecksum == ns->_chatChecksum &&
              (this->_mediaChecksum == ns->_mediaChecksum)))))) && (this->_flags == ns->_flags)) {
          bVar2 = std::operator!=(&this->_metaInfo,&ns->_metaInfo);
          return bVar2;
        }
      }
    }
  }
  return true;
}

Assistant:

bool needsUpdate(const Stream& ns)
    {
        return (_reliveId != ns._reliveId || _stationId != ns._stationId || _name != ns._name ||
                _host != ns._host || _description != ns._description || _timestamp != ns._timestamp ||
                _duration != ns._duration || _size != ns._size || _format != ns._format || _mediaOffset != ns._mediaOffset ||
                _streamInfoChecksum != ns._streamInfoChecksum || _chatChecksum != ns._chatChecksum || _mediaChecksum != ns._mediaChecksum ||
                _flags != ns._flags || _metaInfo != ns._metaInfo);
    }